

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_build_quantizer(aom_bit_depth_t bit_depth,int y_dc_delta_q,int u_dc_delta_q,
                        int u_ac_delta_q,int v_dc_delta_q,int v_ac_delta_q,QUANTS *quants,
                        Dequants *deq,int sharpness)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long in_stack_00000008;
  long in_stack_00000010;
  int qrounding_factor_fp;
  int qrounding_factor;
  int qzbin_factor;
  int sharpness_adjustment;
  int quant_QTX;
  int q;
  int i;
  aom_bit_depth_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar4;
  int iVar5;
  aom_bit_depth_t in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined4 local_1c;
  
  iVar2 = ((7 - qrounding_factor) * 0x10) / 7;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    iVar3 = get_qzbin_factor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = 0x30;
    if (local_20 == 0) {
      in_stack_ffffffffffffffd0 = 0x40;
    }
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffcc = 0x40;
      if ((qrounding_factor != 0) && (local_20 != 0)) {
        in_stack_ffffffffffffffd0 = 0x40 - iVar2;
        in_stack_ffffffffffffffcc = 0x40 - iVar2;
      }
      if (local_1c == 0) {
        sVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      else {
        sVar1 = av1_ac_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      iVar4 = (int)sVar1;
      iVar5 = iVar4;
      invert_quant((int16_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                   (int16_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_stack_ffffffffffffffc4);
      *(short *)(in_stack_00000008 + 0x4000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(0x10000 / (long)iVar4);
      *(short *)(in_stack_00000008 + 0x7000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)((int)(in_stack_ffffffffffffffcc * iVar4) >> 7);
      *(short *)(in_stack_00000008 + 0x2000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(iVar3 * iVar4 + 0x40 >> 7);
      *(short *)(in_stack_00000008 + 0x3000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(in_stack_ffffffffffffffd0 * iVar4 >> 7);
      *(short *)(in_stack_00000010 + (long)local_20 * 0x10 + (long)local_1c * 2) = sVar1;
      if (local_1c == 0) {
        sVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      else {
        sVar1 = av1_ac_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      iVar4 = (int)sVar1;
      in_stack_ffffffffffffffc4 = iVar4;
      invert_quant((int16_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                   (int16_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar5),iVar4);
      *(short *)(in_stack_00000008 + 0x5000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(0x10000 / (long)iVar4);
      *(short *)(in_stack_00000008 + 0x8000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)((int)(in_stack_ffffffffffffffcc * iVar4) >> 7);
      *(short *)(in_stack_00000008 + 0xe000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(iVar3 * iVar4 + 0x40 >> 7);
      *(short *)(in_stack_00000008 + 0x10000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(in_stack_ffffffffffffffd0 * iVar4 >> 7);
      *(short *)(in_stack_00000010 + 0x1000 + (long)local_20 * 0x10 + (long)local_1c * 2) = sVar1;
      if (local_1c == 0) {
        sVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      else {
        sVar1 = av1_ac_quant_QTX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8);
      }
      iVar4 = (int)sVar1;
      in_stack_ffffffffffffffc0 = iVar4;
      invert_quant((int16_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                   (int16_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar5),in_stack_ffffffffffffffc4);
      *(short *)(in_stack_00000008 + 0x6000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(0x10000 / (long)iVar4);
      *(short *)(in_stack_00000008 + 0x9000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)((int)(in_stack_ffffffffffffffcc * iVar4) >> 7);
      *(short *)(in_stack_00000008 + 0xf000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(iVar3 * iVar4 + 0x40 >> 7);
      *(short *)(in_stack_00000008 + 0x11000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           (short)(in_stack_ffffffffffffffd0 * iVar4 >> 7);
      *(short *)(in_stack_00000010 + 0x2000 + (long)local_20 * 0x10 + (long)local_1c * 2) = sVar1;
    }
    for (local_1c = 2; local_1c < 8; local_1c = local_1c + 1) {
      *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 2);
      *(undefined2 *)(in_stack_00000008 + 0x4000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x4002);
      *(undefined2 *)(in_stack_00000008 + 0x7000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x7002);
      *(undefined2 *)(in_stack_00000008 + 0x1000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x1002);
      *(undefined2 *)(in_stack_00000008 + 0x2000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x2002);
      *(undefined2 *)(in_stack_00000008 + 0x3000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x3002);
      *(undefined2 *)(in_stack_00000010 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000010 + (long)local_20 * 0x10 + 2);
      *(undefined2 *)(in_stack_00000008 + 0xa000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xa002);
      *(undefined2 *)(in_stack_00000008 + 0x5000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x5002);
      *(undefined2 *)(in_stack_00000008 + 0x8000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x8002);
      *(undefined2 *)(in_stack_00000008 + 0xc000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xc002);
      *(undefined2 *)(in_stack_00000008 + 0xe000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xe002);
      *(undefined2 *)(in_stack_00000008 + 0x10000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x10002);
      *(undefined2 *)(in_stack_00000010 + 0x1000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000010 + (long)local_20 * 0x10 + 0x1002);
      *(undefined2 *)(in_stack_00000008 + 0xb000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xb002);
      *(undefined2 *)(in_stack_00000008 + 0x6000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x6002);
      *(undefined2 *)(in_stack_00000008 + 0x9000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x9002);
      *(undefined2 *)(in_stack_00000008 + 0xd000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xd002);
      *(undefined2 *)(in_stack_00000008 + 0xf000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0xf002);
      *(undefined2 *)(in_stack_00000008 + 0x11000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000008 + (long)local_20 * 0x10 + 0x11002);
      *(undefined2 *)(in_stack_00000010 + 0x2000 + (long)local_20 * 0x10 + (long)local_1c * 2) =
           *(undefined2 *)(in_stack_00000010 + (long)local_20 * 0x10 + 0x2002);
    }
  }
  return;
}

Assistant:

void av1_build_quantizer(aom_bit_depth_t bit_depth, int y_dc_delta_q,
                         int u_dc_delta_q, int u_ac_delta_q, int v_dc_delta_q,
                         int v_ac_delta_q, QUANTS *const quants,
                         Dequants *const deq, int sharpness) {
  int i, q, quant_QTX;
  const int sharpness_adjustment = 16 * (7 - sharpness) / 7;

  for (q = 0; q < QINDEX_RANGE; q++) {
    const int qzbin_factor = get_qzbin_factor(q, bit_depth);
    int qrounding_factor = q == 0 ? 64 : 48;

    for (i = 0; i < 2; ++i) {
      int qrounding_factor_fp = 64;

      if (sharpness != 0 && q != 0) {
        qrounding_factor = 64 - sharpness_adjustment;
        qrounding_factor_fp = 64 - sharpness_adjustment;
      }

      // y quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, y_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, 0, bit_depth);
      invert_quant(&quants->y_quant[q][i], &quants->y_quant_shift[q][i],
                   quant_QTX);
      quants->y_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->y_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->y_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->y_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->y_dequant_QTX[q][i] = quant_QTX;

      // u quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, u_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, u_ac_delta_q, bit_depth);
      invert_quant(&quants->u_quant[q][i], &quants->u_quant_shift[q][i],
                   quant_QTX);
      quants->u_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->u_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->u_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->u_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->u_dequant_QTX[q][i] = quant_QTX;

      // v quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, v_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, v_ac_delta_q, bit_depth);
      invert_quant(&quants->v_quant[q][i], &quants->v_quant_shift[q][i],
                   quant_QTX);
      quants->v_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->v_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->v_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->v_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->v_dequant_QTX[q][i] = quant_QTX;
    }

    for (i = 2; i < 8; i++) {  // 8: SIMD width
      quants->y_quant[q][i] = quants->y_quant[q][1];
      quants->y_quant_fp[q][i] = quants->y_quant_fp[q][1];
      quants->y_round_fp[q][i] = quants->y_round_fp[q][1];
      quants->y_quant_shift[q][i] = quants->y_quant_shift[q][1];
      quants->y_zbin[q][i] = quants->y_zbin[q][1];
      quants->y_round[q][i] = quants->y_round[q][1];
      deq->y_dequant_QTX[q][i] = deq->y_dequant_QTX[q][1];

      quants->u_quant[q][i] = quants->u_quant[q][1];
      quants->u_quant_fp[q][i] = quants->u_quant_fp[q][1];
      quants->u_round_fp[q][i] = quants->u_round_fp[q][1];
      quants->u_quant_shift[q][i] = quants->u_quant_shift[q][1];
      quants->u_zbin[q][i] = quants->u_zbin[q][1];
      quants->u_round[q][i] = quants->u_round[q][1];
      deq->u_dequant_QTX[q][i] = deq->u_dequant_QTX[q][1];

      quants->v_quant[q][i] = quants->v_quant[q][1];
      quants->v_quant_fp[q][i] = quants->v_quant_fp[q][1];
      quants->v_round_fp[q][i] = quants->v_round_fp[q][1];
      quants->v_quant_shift[q][i] = quants->v_quant_shift[q][1];
      quants->v_zbin[q][i] = quants->v_zbin[q][1];
      quants->v_round[q][i] = quants->v_round[q][1];
      deq->v_dequant_QTX[q][i] = deq->v_dequant_QTX[q][1];
    }
  }
}